

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O3

void CESkyCoord::CIRS2Observed
               (CESkyCoord *in_cirs,CESkyCoord *out_observed,CEDate *date,CEObserver *observer,
               CESkyCoord *observed_cirs,CEAngle *hour_angle)

{
  int iVar1;
  sofa_error *this;
  double dVar2;
  undefined8 extraout_XMM0_Qa;
  CEAngle CVar3;
  double zen;
  double az;
  double temp_hour_angle;
  double temp_dec;
  double temp_ra;
  allocator local_17b;
  allocator local_17a;
  allocator local_179;
  CEAngle local_178;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  string local_140;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  CEAngle *local_d8;
  undefined8 local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  CEDate local_b0;
  CEDate local_70;
  
  local_148 = 0.0;
  local_150 = 0.0;
  local_158 = 0.0;
  local_160 = 0.0;
  local_168 = 0.0;
  local_d8 = hour_angle;
  dVar2 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_70,dVar2,JD);
  (*in_cirs->_vptr_CESkyCoord[3])(&local_140,in_cirs,&local_70);
  local_b8 = CEAngle::operator_cast_to_double((CEAngle *)&local_140);
  dVar2 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_b0,dVar2,JD);
  (*in_cirs->_vptr_CESkyCoord[4])(&local_178,in_cirs,&local_b0);
  local_c0 = CEAngle::operator_cast_to_double(&local_178);
  local_c8 = CEDate::GetMJD2JDFactor();
  (*date->_vptr_CEDate[5])(date);
  local_d0 = extraout_XMM0_Qa;
  local_e0 = CEDate::dut1(date);
  local_e8 = CEObserver::Longitude_Rad(observer);
  local_f0 = CEObserver::Latitude_Rad(observer);
  local_f8 = CEObserver::Elevation_m(observer);
  local_100 = CEDate::xpolar(date);
  local_108 = CEDate::ypolar(date);
  local_110 = CEObserver::Pressure_hPa(observer);
  local_118 = CEObserver::Temperature_C(observer);
  local_120 = CEObserver::RelativeHumidity(observer);
  CEObserver::Wavelength_um(observer);
  iVar1 = iauAtio13(local_b8,local_c0,local_c8,local_d0,local_e0,local_e8,local_f0,local_f8,
                    &local_160,&local_168,&local_158,&local_148,&local_150);
  CEAngle::~CEAngle(&local_178);
  CEDate::~CEDate(&local_b0);
  CEAngle::~CEAngle((CEAngle *)&local_140);
  CEDate::~CEDate(&local_70);
  if (iVar1 != -1) {
    CEAngle::Rad((CEAngle *)&local_70,&local_160);
    CVar3 = CEAngle::Rad((CEAngle *)&local_b0,&local_168);
    local_140._M_dataplus._M_p._0_4_ = 3;
    (*out_observed->_vptr_CESkyCoord[5])(CVar3.angle_,out_observed,&local_70,&local_b0);
    CEAngle::~CEAngle((CEAngle *)&local_b0);
    CEAngle::~CEAngle((CEAngle *)&local_70);
    if (observed_cirs != (CESkyCoord *)0x0) {
      CEAngle::Rad((CEAngle *)&local_70,&local_148);
      CVar3 = CEAngle::Rad((CEAngle *)&local_b0,&local_150);
      local_140._M_dataplus._M_p._0_4_ = 0;
      (*observed_cirs->_vptr_CESkyCoord[5])(CVar3.angle_,observed_cirs,&local_70,&local_b0);
      CEAngle::~CEAngle((CEAngle *)&local_b0);
      CEAngle::~CEAngle((CEAngle *)&local_70);
    }
    if (local_d8 != (CEAngle *)0x0) {
      local_70._vptr_CEDate._0_4_ = 1;
      CEAngle::SetAngle(local_d8,&local_158,(CEAngleType *)&local_70);
    }
    return;
  }
  this = (sofa_error *)__cxa_allocate_exception(0xa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"CESkyCoord::CIRS2Observed",&local_17b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"iauAtio13",&local_179);
  local_178._vptr_CEAngle._0_4_ = 0xffffffff;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_140,"SOFA method was passed an unacceptable date",&local_17a);
  CEException::sofa_error::sofa_error
            (this,(string *)&local_70,(string *)&local_b0,(int *)&local_178,&local_140);
  __cxa_throw(this,&CEException::sofa_error::typeinfo,CEExceptionHandler::~CEExceptionHandler);
}

Assistant:

void CESkyCoord::CIRS2Observed(const CESkyCoord& in_cirs,
                               CESkyCoord*       out_observed,
                               const CEDate&     date,
                               const CEObserver& observer,
                               CESkyCoord*       observed_cirs,
                               CEAngle*          hour_angle)
{
    // Setup the observed RA, Dec and hour_angle variables
    double temp_ra(0.0);
    double temp_dec(0.0);
    double temp_hour_angle(0.0);

    // Call the necessary sofa method
    double az(0.0);
    double zen(0.0);
    int err_code = iauAtio13(in_cirs.XCoord(), 
                             in_cirs.YCoord(),
                             CEDate::GetMJD2JDFactor(), date.MJD(),
                             date.dut1(),
                             observer.Longitude_Rad(),
                             observer.Latitude_Rad(),
                             observer.Elevation_m(),
                             date.xpolar(), date.ypolar(),
                             observer.Pressure_hPa(),
                             observer.Temperature_C(),
                             observer.RelativeHumidity(),
                             observer.Wavelength_um(),
                             &az, &zen,
                             &temp_hour_angle, 
                             &temp_ra, &temp_dec);
    
    // Handle the error code
    if (err_code == -1) {
        throw CEException::sofa_error("CESkyCoord::CIRS2Observed",
                                      "iauAtio13", -1,
                                      "SOFA method was passed an unacceptable date");
    }

    // Set the output coordinates
    out_observed->SetCoordinates(CEAngle::Rad(az), CEAngle::Rad(zen), 
                                 CESkyCoordType::OBSERVED);

    // If passed, set the observed CIRS coordinates
    if (observed_cirs != nullptr) {
        observed_cirs->SetCoordinates(CEAngle::Rad(temp_ra), CEAngle::Rad(temp_dec),
                                      CESkyCoordType::CIRS);
    }

    // Set the hour angle
    if (hour_angle != nullptr) {
        hour_angle->SetAngle(temp_hour_angle, CEAngleType::RADIANS);
    }

    return;
}